

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall QTableModel::clearItemData(QTableModel *this,QModelIndex *index)

{
  QWidgetItemData *pQVar1;
  char cVar2;
  QTableWidgetItem *pQVar3;
  long lVar4;
  long lVar5;
  QWidgetItemData *pQVar6;
  bool bVar7;
  QWidgetItemData *pQVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QAbstractItemModel::checkIndex(this,index,1);
  if ((cVar2 == '\0') || (pQVar3 = item(this,index), pQVar3 == (QTableWidgetItem *)0x0)) {
    bVar7 = false;
    goto LAB_00535ea2;
  }
  pQVar8 = (pQVar3->values).d.ptr;
  lVar5 = (pQVar3->values).d.size;
  lVar4 = lVar5 * 0x28;
  pQVar1 = pQVar8 + lVar5;
  pQVar8 = pQVar8 + 2;
  for (lVar5 = lVar5 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    if (3 < *(ulong *)&pQVar8[-2].value.d.field_0x18) {
      pQVar6 = pQVar8 + -2;
      goto LAB_00535e6d;
    }
    if (3 < *(ulong *)&pQVar8[-1].value.d.field_0x18) {
      pQVar6 = pQVar8 + -1;
      goto LAB_00535e6d;
    }
    pQVar6 = pQVar8;
    if (3 < *(ulong *)&(pQVar8->value).d.field_0x18) goto LAB_00535e6d;
    if (3 < *(ulong *)&pQVar8[1].value.d.field_0x18) {
      pQVar6 = pQVar8 + 1;
      goto LAB_00535e6d;
    }
    pQVar8 = pQVar8 + 4;
    lVar4 = lVar4 + -0xa0;
  }
  lVar4 = lVar4 / 0x28;
  pQVar6 = pQVar8 + -2;
  if (lVar4 == 1) {
LAB_00535ed8:
    if (*(ulong *)&(pQVar6->value).d.field_0x18 < 4) {
      pQVar6 = pQVar1;
    }
  }
  else if (lVar4 == 3) {
    if (*(ulong *)&pQVar8[-2].value.d.field_0x18 < 4) {
      pQVar6 = pQVar8 + -1;
      goto LAB_00535ecd;
    }
  }
  else {
    bVar7 = true;
    if (lVar4 != 2) goto LAB_00535ea2;
LAB_00535ecd:
    if (*(ulong *)&(pQVar6->value).d.field_0x18 < 4) {
      pQVar6 = pQVar6 + 1;
      goto LAB_00535ed8;
    }
  }
LAB_00535e6d:
  bVar7 = true;
  if (pQVar6 != pQVar1) {
    QList<QWidgetItemData>::clear(&pQVar3->values);
    local_48.d = (Data *)0x0;
    local_48.ptr = (int *)0x0;
    local_48.size = 0;
    QAbstractItemModel::dataChanged((QModelIndex *)this,index,(QList_conflict *)index);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  }
LAB_00535ea2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QTableModel::clearItemData(const QModelIndex &index)
{
    if (!checkIndex(index, CheckIndexOption::IndexIsValid))
        return false;
    QTableWidgetItem *itm = item(index);
    if (!itm)
        return false;
    const auto beginIter = itm->values.cbegin();
    const auto endIter = itm->values.cend();
    if (std::all_of(beginIter, endIter, [](const QWidgetItemData& data) -> bool { return !data.value.isValid(); }))
        return true; //it's already cleared
    itm->values.clear();
    emit dataChanged(index, index, QList<int> {});
    return true;
}